

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  StorageClass SVar1;
  SPIRVariable *pSVar2;
  bool bVar3;
  bool bVar4;
  ExecutionModel EVar5;
  uint32_t uVar6;
  int iVar7;
  ulong uVar8;
  Bitset *pBVar9;
  Variant *pVVar10;
  uint *puVar11;
  char *pcVar12;
  char *__s1;
  byte bVar13;
  undefined3 in_register_00000081;
  bool bVar14;
  char *addr_space;
  Bitset flags;
  allocator local_c9;
  SPIRVariable *local_c8;
  uint local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  Bitset local_b0;
  undefined1 local_70 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_bc = CONCAT31(in_register_00000081,argument);
  local_70 = (undefined1  [8])0x0;
  local_68._M_buckets = &(((Bitset *)local_70)->higher)._M_h._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  uVar8 = (ulong)id;
  if ((uVar8 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar10 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.ptr, pVVar10[uVar8].type == TypeVariable)) {
    local_c8 = Variant::get<spirv_cross::SPIRVariable>(pVVar10 + uVar8);
    bVar13 = 1;
    if ((type->basetype != Struct) ||
       ((bVar3 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block)
        , !bVar3 &&
        (bVar3 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock), !bVar3
        )))) goto LAB_0022a4be;
    Compiler::get_buffer_block_flags(&local_b0,(Compiler *)this,(VariableID)id);
    local_70 = (undefined1  [8])local_b0.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&(((Bitset *)local_70)->higher)._M_h,&local_b0.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b0.higher._M_h);
    bVar13 = 1;
  }
  else {
    bVar13 = 0;
    local_c8 = (SPIRVariable *)0x0;
LAB_0022a4be:
    pBVar9 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    pVVar10 = (Variant *)pBVar9->lower;
    local_70 = (undefined1  [8])pVVar10;
    if (pBVar9 != (Bitset *)local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&((Bitset *)local_70)->higher,&(pBVar9->higher)._M_h);
    }
  }
  local_b0.lower = 0;
  SVar1 = type->storage;
  puVar11 = &switchD_0022a50d::switchdataD_0038690c;
  switch(SVar1) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case PushConstant:
    if (type->basetype == Struct) {
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,BufferBlock);
      puVar11 = (uint *)0x38ac58;
      pcVar12 = "const device";
      if (((uint)local_70._0_4_ >> 0x18 & 1) == 0) {
        pcVar12 = "device";
      }
      __s1 = "constant";
      local_b0.lower = (uint64_t)"constant";
      if (bVar3) {
        __s1 = pcVar12;
        local_b0.lower = (uint64_t)pcVar12;
      }
      goto LAB_0022a817;
    }
    if ((char)local_bc == '\0') {
      __s1 = "constant";
      local_b0.lower = (uint64_t)"constant";
      goto LAB_0022a817;
    }
    if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      __s1 = "";
      local_b0.lower = (uint64_t)"";
      goto LAB_0022a817;
    }
    break;
  case Input:
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar5 == ExecutionModelTessellationControl && (bVar13 ^ 1) == 0) &&
       ((local_c8->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      __s1 = "threadgroup";
      local_b0.lower = (uint64_t)__s1;
      if ((this->msl_options).multi_patch_workgroup != false) {
        __s1 = "const device";
        local_b0.lower = (uint64_t)__s1;
      }
    }
    else {
      __s1 = (char *)0x0;
    }
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    pSVar2 = local_c8;
    if ((EVar5 == ExecutionModelTessellationEvaluation) &&
       ((bVar13 & (this->msl_options).raw_buffer_tese_input) != 0)) {
      local_b4 = (local_c8->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar3 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(local_c8->super_IVariant).self.id,DecorationPatch);
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar2->super_IVariant).self.id,BuiltIn);
      uVar6 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(pSVar2->super_IVariant).self.id,BuiltIn);
      bVar14 = uVar6 - 0xb < 2;
      puVar11 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) ||
         (puVar11 = (uint *)(ulong)CONCAT31((int3)(local_b8 >> 8),bVar4 && bVar14),
         bVar3 && (!bVar4 || !bVar14))) {
        __s1 = "const device";
        local_b0.lower = 0x392b79;
      }
    }
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if (((bVar13 ^ 1) == 0 && EVar5 == ExecutionModelFragment) &&
       ((local_c8->basevariable).id == (this->stage_in_var_id).id)) {
      __s1 = "thread";
      local_b0.lower = (uint64_t)"thread";
      goto LAB_0022a817;
    }
    goto LAB_0022a7e1;
  case Output:
    if (this->capture_output_to_buffer == true) {
      if (bVar13 == 0) {
LAB_0022a7bd:
        local_b0.lower = 0x38ac58;
      }
      else {
        bVar3 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,local_c8);
        if (bVar3) {
          bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
          if (bVar3) {
LAB_0022a7aa:
            local_b0.lower = 0x38ad0b;
          }
          else {
            local_b0.lower = 0x38abd8;
          }
        }
        else {
          iVar7 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,local_c8,4)
          ;
          if ((char)iVar7 != '\0') goto LAB_0022a7aa;
          if ((char *)local_b0.lower == (char *)0x0) goto LAB_0022a7bd;
        }
      }
    }
    __s1 = (char *)local_b0.lower;
    EVar5 = Compiler::get_execution_model((Compiler *)this);
    if (EVar5 == ExecutionModelMeshEXT) goto switchD_0022a50d_caseD_4;
LAB_0022a7e1:
    if (__s1 != (char *)0x0) goto LAB_0022a817;
    break;
  case StorageClassWorkgroup:
switchD_0022a50d_caseD_4:
    __s1 = "threadgroup";
    local_b0.lower = (uint64_t)"threadgroup";
    goto LAB_0022a817;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    break;
  case StorageBuffer:
switchD_0022a50d_caseD_c:
    if ((bVar13 == 0) ||
       (bVar3 = Compiler::has_decoration((Compiler *)this,(ID)(type->super_IVariant).self.id,Block),
       bVar3)) {
      __s1 = "const device";
      local_b0.lower = (uint64_t)"const device";
      if (((ulong)local_70 & 0x1000000) == 0) {
        __s1 = "device";
        local_b0.lower = (uint64_t)"device";
      }
    }
    else {
      __s1 = "device";
      local_b0.lower = (uint64_t)"device";
    }
    goto LAB_0022a817;
  default:
    puVar11 = (uint *)pVVar10;
    if (SVar1 == PhysicalStorageBuffer) goto switchD_0022a50d_caseD_c;
    if (SVar1 == StorageClassTaskPayloadWorkgroupEXT) {
      EVar5 = Compiler::get_execution_model((Compiler *)this);
      puVar11 = (uint *)pVVar10;
      if (EVar5 == ExecutionModelMeshEXT) {
        __s1 = "const object_data";
        local_b0.lower = (uint64_t)"const object_data";
      }
      else {
        __s1 = "object_data";
        local_b0.lower = (uint64_t)"object_data";
      }
      goto LAB_0022a817;
    }
  }
  puVar11 = (uint *)0x34ea49;
  __s1 = "";
  if (type->basetype == ControlPointArray) {
    __s1 = "thread";
  }
  if ((local_bc & 1) == 0) {
    __s1 = "";
  }
  local_b0.lower = (uint64_t)__s1;
  if (type->pointer != false) {
    __s1 = "thread";
    local_b0.lower = (uint64_t)"thread";
  }
LAB_0022a817:
  if ((((ulong)local_70 & 0xa00000) == 0) || (iVar7 = strcmp(__s1,"thread"), iVar7 == 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__s1,&local_c9);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (__return_storage_ptr__,(spirv_cross *)"volatile ",(char (*) [10])&local_b0,
               (char **)puVar11);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(((Bitset *)local_70)->higher)._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}

		if (is_mesh_shader())
			addr_space = "threadgroup";
		break;

	case StorageClassTaskPayloadWorkgroupEXT:
		if (is_mesh_shader())
			addr_space = "const object_data";
		else
			addr_space = "object_data";
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}